

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O1

Result wabt::GenerateNames(Module *module,NameOpts opts)

{
  ulong *puVar1;
  Import *pIVar2;
  pointer pcVar3;
  pointer ppEVar4;
  Export *pEVar5;
  pointer pTVar6;
  pointer pTVar7;
  Index IVar8;
  Index IVar9;
  Index IVar10;
  pointer ppIVar11;
  Index IVar12;
  Result RVar13;
  long *plVar14;
  Func *pFVar15;
  pointer ppGVar16;
  pointer ppTVar17;
  pointer ppFVar18;
  pointer ppTVar19;
  pointer ppMVar20;
  pointer ppTVar21;
  pointer ppDVar22;
  pointer ppEVar23;
  pointer ppIVar24;
  char *prefix;
  FuncImport *func_import;
  long lVar25;
  BindingHash *pBVar26;
  pointer ppIVar27;
  Import *str;
  pointer ppEVar28;
  ulong uVar29;
  Module *pMVar30;
  __string_type __str;
  string new_name;
  NameGenerator generator;
  undefined1 local_118 [32];
  Module *local_f8;
  pointer local_f0;
  string local_e8;
  NameGenerator local_c8;
  
  local_c8.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameGenerator_0017eb18;
  local_c8.module_ = (Module *)0x0;
  ExprVisitor::ExprVisitor(&local_c8.visitor_,(Delegate *)&local_c8);
  local_c8.num_global_imports_ = 0;
  local_c8.num_tag_imports_ = 0;
  local_c8.label_count_ = 0;
  local_c8.num_func_imports_ = 0;
  local_c8.num_table_imports_ = 0;
  local_c8.num_memory_imports_ = 0;
  ppIVar27 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar24 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_f8 = module;
  ppIVar11 = ppIVar24;
  local_c8.module_ = module;
  local_c8.opts_ = opts;
  if (ppIVar27 != ppIVar24) {
    do {
      local_f0 = ppIVar11;
      pIVar2 = *ppIVar27;
      IVar9 = local_c8.num_global_imports_;
      IVar10 = local_c8.num_tag_imports_;
      IVar12 = local_c8.num_table_imports_;
      IVar8 = local_c8.num_memory_imports_;
      switch(pIVar2->kind_) {
      case First:
        if (pIVar2 == (Import *)0x0) break;
        pBVar26 = &(local_c8.module_)->func_bindings;
        str = pIVar2 + 1;
        IVar12 = local_c8.num_func_imports_;
        local_c8.num_func_imports_ = local_c8.num_func_imports_ + 1;
        goto LAB_00130bea;
      case Table:
        if (pIVar2 != (Import *)0x0) {
          pBVar26 = &(local_c8.module_)->table_bindings;
          str = pIVar2 + 1;
          local_c8.num_table_imports_ = local_c8.num_table_imports_ + 1;
          goto LAB_00130bea;
        }
        break;
      case Memory:
        if (pIVar2 != (Import *)0x0) {
          pBVar26 = &(local_c8.module_)->memory_bindings;
          str = pIVar2 + 1;
          local_c8.num_memory_imports_ = local_c8.num_memory_imports_ + 1;
          IVar12 = IVar8;
          goto LAB_00130bea;
        }
        break;
      case Global:
        if (pIVar2 != (Import *)0x0) {
          pBVar26 = &(local_c8.module_)->global_bindings;
          str = pIVar2 + 1;
          local_c8.num_global_imports_ = local_c8.num_global_imports_ + 1;
          IVar12 = IVar9;
          goto LAB_00130bea;
        }
        break;
      case Last:
        if (pIVar2 != (Import *)0x0) {
          pBVar26 = &(local_c8.module_)->tag_bindings;
          str = pIVar2 + 1;
          local_c8.num_tag_imports_ = local_c8.num_tag_imports_ + 1;
          IVar12 = IVar10;
          goto LAB_00130bea;
        }
      }
      str = (Import *)0x0;
      pBVar26 = (BindingHash *)0x0;
      IVar12 = 0xffffffff;
LAB_00130bea:
      if ((pBVar26 != (BindingHash *)0x0) && (str != (Import *)0x0)) {
        if (IVar12 == 0xffffffff) {
          __assert_fail("index != kInvalidIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/generate-names.cc"
                        ,0x152,
                        "Result wabt::(anonymous namespace)::NameGenerator::VisitImport(Import *)");
        }
        local_118._0_8_ = local_118 + 0x10;
        pcVar3 = (pIVar2->module_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,pcVar3,pcVar3 + (pIVar2->module_name)._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)local_118,local_118._8_8_,0,'\x01');
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    (local_118,(ulong)(pIVar2->field_name)._M_dataplus._M_p);
        puVar1 = (ulong *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar1) {
          local_e8.field_2._M_allocated_capacity = *puVar1;
          local_e8.field_2._8_8_ = plVar14[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *puVar1;
          local_e8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_e8._M_string_length = plVar14[1];
        *plVar14 = (long)puVar1;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_118._16_8_)->_M_p + 1));
        }
        anon_unknown_17::NameGenerator::MaybeUseAndBindName
                  (&local_c8,pBVar26,local_e8._M_dataplus._M_p,IVar12,(string *)str);
        ppIVar24 = local_f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          ppIVar24 = local_f0;
        }
      }
      ppIVar27 = ppIVar27 + 1;
      ppIVar11 = local_f0;
    } while (ppIVar27 != ppIVar24);
  }
  ppEVar4 = (local_f8->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar28 = (local_f8->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; pMVar30 = local_f8, ppEVar28 != ppEVar4;
      ppEVar28 = ppEVar28 + 1) {
    pEVar5 = *ppEVar28;
    IVar12 = 0xffffffff;
    switch(pEVar5->kind) {
    case First:
      pFVar15 = Module::GetFunc(local_c8.module_,&pEVar5->var);
      if (pFVar15 == (Func *)0x0) break;
      IVar12 = Module::GetFuncIndex(local_c8.module_,&pEVar5->var);
      lVar25 = 0x1c8;
LAB_00130e46:
      pBVar26 = (BindingHash *)((long)&((local_c8.module_)->loc).filename._M_len + lVar25);
      goto LAB_00130e50;
    case Table:
      pFVar15 = (Func *)Module::GetTable(local_c8.module_,&pEVar5->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetTableIndex(local_c8.module_,&pEVar5->var);
        lVar25 = 0x2a8;
        goto LAB_00130e46;
      }
      break;
    case Memory:
      pFVar15 = (Func *)Module::GetMemory(local_c8.module_,&pEVar5->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetMemoryIndex(local_c8.module_,&pEVar5->var);
        lVar25 = 0x2e0;
        goto LAB_00130e46;
      }
      break;
    case Global:
      pFVar15 = (Func *)Module::GetGlobal(local_c8.module_,&pEVar5->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetGlobalIndex(local_c8.module_,&pEVar5->var);
        lVar25 = 0x200;
        goto LAB_00130e46;
      }
      break;
    case Last:
      pFVar15 = (Func *)Module::GetTag(local_c8.module_,&pEVar5->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetTagIndex(local_c8.module_,&pEVar5->var);
        lVar25 = 400;
        goto LAB_00130e46;
      }
    }
    pFVar15 = (Func *)0x0;
    pBVar26 = (BindingHash *)0x0;
LAB_00130e50:
    if ((pFVar15 != (Func *)0x0) && (pBVar26 != (BindingHash *)0x0)) {
      anon_unknown_17::NameGenerator::MaybeUseAndBindName
                (&local_c8,pBVar26,(pEVar5->name)._M_dataplus._M_p,IVar12,&pFVar15->name);
    }
  }
  ppGVar16 = (local_f8->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((local_f8->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppGVar16) {
    uVar29 = 0;
    do {
      if ((ppGVar16[uVar29]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->global_bindings,"g",(Index)uVar29,
                   &ppGVar16[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppGVar16 = (pMVar30->globals).
                 super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(pMVar30->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar16 >> 3
                             ));
  }
  ppTVar17 = (pMVar30->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((pMVar30->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppTVar17) {
    uVar29 = 0;
    do {
      if ((ppTVar17[uVar29]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->type_bindings,"t",(Index)uVar29,
                   &ppTVar17[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppTVar17 = (pMVar30->types).
                 super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(pMVar30->types).
                                    super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar17 >> 3
                             ));
  }
  ppFVar18 = (pMVar30->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((pMVar30->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar18) {
    ppIVar27 = (pointer)0x0;
    do {
      pFVar15 = ppFVar18[(long)ppIVar27];
      if ((pFVar15->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->func_bindings,"f",(Index)ppIVar27,&pFVar15->name);
      }
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (pointer)0x0;
      local_118._16_8_ = (pointer)0x0;
      pTVar6 = (pFVar15->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar7 = (pFVar15->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f0 = ppIVar27;
      IVar12 = LocalTypes::size(&pFVar15->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)((int)((ulong)((long)pTVar6 - (long)pTVar7) >> 3) + IVar12),
                 &pFVar15->bindings,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_118);
      if (local_118._8_8_ != local_118._0_8_) {
        lVar25 = 0;
        uVar29 = 0;
        do {
          if (*(long *)((long)(local_118._0_8_ + 8) + lVar25) == 0) {
            prefix = "p";
            if (((ulong)((long)(pFVar15->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pFVar15->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff) <= uVar29) {
              prefix = "l";
            }
            local_e8._M_string_length = 0;
            local_e8.field_2._M_allocated_capacity =
                 local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            anon_unknown_17::NameGenerator::GenerateAndBindName
                      (&local_c8,&pFVar15->bindings,prefix,(Index)uVar29,&local_e8);
            std::__cxx11::string::_M_assign
                      ((string *)((long)&((_Alloc_hider *)local_118._0_8_)->_M_p + lVar25));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
          }
          uVar29 = uVar29 + 1;
          lVar25 = lVar25 + 0x20;
        } while (uVar29 < (ulong)((long)(local_118._8_8_ - local_118._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
      local_c8._120_8_ = local_c8._120_8_ & 0xffffffff00000000;
      RVar13 = ExprVisitor::VisitFunc(&local_c8.visitor_,pFVar15);
      pMVar30 = local_f8;
      if (RVar13.enum_ == Error) break;
      ppIVar27 = (pointer)(ulong)((int)local_f0 + 1);
      ppFVar18 = (local_f8->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (ppIVar27 <
             (pointer)((long)(local_f8->funcs).
                             super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppFVar18 >> 3));
  }
  ppTVar19 = (pMVar30->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((pMVar30->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar19) {
    uVar29 = 0;
    do {
      if ((ppTVar19[uVar29]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->table_bindings,"T",(Index)uVar29,
                   &ppTVar19[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppTVar19 = (pMVar30->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(pMVar30->tables).
                                    super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar19 >> 3
                             ));
  }
  ppMVar20 = (pMVar30->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((pMVar30->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppMVar20) {
    uVar29 = 0;
    do {
      if ((ppMVar20[uVar29]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->memory_bindings,"M",(Index)uVar29,
                   &ppMVar20[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppMVar20 = (pMVar30->memories).
                 super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(pMVar30->memories).
                                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar20 >> 3
                             ));
  }
  ppTVar21 = (pMVar30->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((pMVar30->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar21) {
    uVar29 = 0;
    do {
      if ((ppTVar21[uVar29]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->tag_bindings,"e",(Index)uVar29,
                   &ppTVar21[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppTVar21 = (pMVar30->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(pMVar30->tags).
                                    super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar21 >> 3)
            );
  }
  ppDVar22 = (pMVar30->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((pMVar30->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar22) {
    uVar29 = 0;
    do {
      if ((ppDVar22[uVar29]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->data_segment_bindings,"d",(Index)uVar29,
                   &ppDVar22[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppDVar22 = (pMVar30->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(pMVar30->data_segments).
                                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar22 >> 3
                             ));
  }
  ppEVar23 = (pMVar30->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((pMVar30->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar23) {
    uVar29 = 0;
    do {
      if ((ppEVar23[uVar29]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->elem_segment_bindings,"e",(Index)uVar29,
                   &ppEVar23[uVar29]->name);
      }
      uVar29 = (ulong)((Index)uVar29 + 1);
      ppEVar23 = (pMVar30->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar29 < (ulong)((long)(pMVar30->elem_segments).
                                    super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar23 >> 3
                             ));
  }
  local_c8.module_ = (Module *)0x0;
  local_c8.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameGenerator_0017eb18;
  if (local_c8.visitor_.catch_index_stack_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.catch_index_stack_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.visitor_.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.visitor_.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.visitor_.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.visitor_.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.visitor_.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.visitor_.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.visitor_.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)Ok;
}

Assistant:

Result GenerateNames(Module* module, NameOpts opts) {
  NameGenerator generator(opts);
  return generator.VisitModule(module);
}